

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersector1<4,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Geometry *this;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 (*pauVar21) [16];
  bool bVar22;
  bool bVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  byte bVar29;
  size_t i;
  long lVar30;
  undefined4 uVar31;
  ulong unaff_R15;
  undefined4 uVar33;
  long lVar32;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  ulong local_1018;
  undefined1 (*local_1010) [16];
  long local_1008;
  ulong local_1000;
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  undefined1 local_f78 [8];
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_f78 = (undefined1  [8])*(undefined8 *)&This->ptr[1].bounds.bounds0.lower.field_0;
  uStack_f70 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar54 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar1 = (context->query_radius).field_0;
    auVar35 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
    auVar54 = ZEXT1664(auVar35);
  }
  local_1010 = (undefined1 (*) [16])local_f68;
  local_1028 = *(float *)&(query->p).field_0;
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  local_1038 = *(float *)((long)&(query->p).field_0 + 4);
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  local_1048 = *(float *)((long)&(query->p).field_0 + 8);
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  uVar33 = *(undefined4 *)&(context->query_radius).field_0;
  auVar35._4_4_ = uVar33;
  auVar35._0_4_ = uVar33;
  auVar35._8_4_ = uVar33;
  auVar35._12_4_ = uVar33;
  uVar33 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar37._4_4_ = uVar33;
  auVar37._0_4_ = uVar33;
  auVar37._8_4_ = uVar33;
  auVar37._12_4_ = uVar33;
  uVar33 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar41._4_4_ = uVar33;
  auVar41._0_4_ = uVar33;
  auVar41._8_4_ = uVar33;
  auVar41._12_4_ = uVar33;
  bVar23 = false;
  local_1018 = unaff_R15;
  do {
    auVar11._4_4_ = fStack_1024;
    auVar11._0_4_ = local_1028;
    auVar11._8_4_ = fStack_1020;
    auVar11._12_4_ = fStack_101c;
    local_fa8 = vsubps_avx(auVar11,auVar35);
    fVar5 = auVar35._0_4_;
    fVar6 = auVar35._4_4_;
    fVar7 = auVar35._8_4_;
    fVar8 = auVar35._12_4_;
    local_fb8 = local_1028 + fVar5;
    fStack_fb4 = fStack_1024 + fVar6;
    fStack_fb0 = fStack_1020 + fVar7;
    fStack_fac = fStack_101c + fVar8;
    auVar10._4_4_ = fStack_1034;
    auVar10._0_4_ = local_1038;
    auVar10._8_4_ = fStack_1030;
    auVar10._12_4_ = fStack_102c;
    local_fc8 = vsubps_avx(auVar10,auVar37);
    local_fd8 = local_1038 + auVar37._0_4_;
    fStack_fd4 = fStack_1034 + auVar37._4_4_;
    fStack_fd0 = fStack_1030 + auVar37._8_4_;
    fStack_fcc = fStack_102c + auVar37._12_4_;
    auVar9._4_4_ = fStack_1044;
    auVar9._0_4_ = local_1048;
    auVar9._8_4_ = fStack_1040;
    auVar9._12_4_ = fStack_103c;
    local_fe8 = vsubps_avx(auVar9,auVar41);
    local_ff8._0_4_ = local_1048 + auVar41._0_4_;
    local_ff8._4_4_ = fStack_1044 + auVar41._4_4_;
    local_ff8._8_4_ = fStack_1040 + auVar41._8_4_;
    local_ff8._12_4_ = fStack_103c + auVar41._12_4_;
    local_f88 = fVar5 * fVar5;
    fStack_f84 = fVar6 * fVar6;
    fStack_f80 = fVar7 * fVar7;
    fStack_f7c = fVar8 * fVar8;
    local_f98 = auVar54._0_16_;
    do {
      do {
        do {
          if (local_1010 == (undefined1 (*) [16])local_f78) {
            return bVar23;
          }
          pauVar21 = local_1010 + -1;
          local_1010 = local_1010 + -1;
        } while (auVar54._0_4_ < *(float *)(*pauVar21 + 8));
        uVar26 = *(ulong *)*local_1010;
        do {
          uVar33 = (undefined4)(local_1018 >> 0x20);
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar26 & 8) == 0) {
              uVar25 = uVar26 & 0xfffffffffffffff0;
              fVar5 = query->time;
              auVar34._4_4_ = fVar5;
              auVar34._0_4_ = fVar5;
              auVar34._8_4_ = fVar5;
              auVar34._12_4_ = fVar5;
              auVar38._0_4_ = fVar5 * *(float *)(uVar25 + 0x80) + *(float *)(uVar25 + 0x20);
              auVar38._4_4_ = fVar5 * *(float *)(uVar25 + 0x84) + *(float *)(uVar25 + 0x24);
              auVar38._8_4_ = fVar5 * *(float *)(uVar25 + 0x88) + *(float *)(uVar25 + 0x28);
              auVar38._12_4_ = fVar5 * *(float *)(uVar25 + 0x8c) + *(float *)(uVar25 + 0x2c);
              auVar42._0_4_ = fVar5 * *(float *)(uVar25 + 0xa0) + *(float *)(uVar25 + 0x40);
              auVar42._4_4_ = fVar5 * *(float *)(uVar25 + 0xa4) + *(float *)(uVar25 + 0x44);
              auVar42._8_4_ = fVar5 * *(float *)(uVar25 + 0xa8) + *(float *)(uVar25 + 0x48);
              auVar42._12_4_ = fVar5 * *(float *)(uVar25 + 0xac) + *(float *)(uVar25 + 0x4c);
              auVar45._0_4_ = fVar5 * *(float *)(uVar25 + 0xc0) + *(float *)(uVar25 + 0x60);
              auVar45._4_4_ = fVar5 * *(float *)(uVar25 + 0xc4) + *(float *)(uVar25 + 100);
              auVar45._8_4_ = fVar5 * *(float *)(uVar25 + 200) + *(float *)(uVar25 + 0x68);
              auVar45._12_4_ = fVar5 * *(float *)(uVar25 + 0xcc) + *(float *)(uVar25 + 0x6c);
              auVar48._0_4_ = fVar5 * *(float *)(uVar25 + 0x90) + *(float *)(uVar25 + 0x30);
              auVar48._4_4_ = fVar5 * *(float *)(uVar25 + 0x94) + *(float *)(uVar25 + 0x34);
              auVar48._8_4_ = fVar5 * *(float *)(uVar25 + 0x98) + *(float *)(uVar25 + 0x38);
              auVar48._12_4_ = fVar5 * *(float *)(uVar25 + 0x9c) + *(float *)(uVar25 + 0x3c);
              auVar50._0_4_ = fVar5 * *(float *)(uVar25 + 0xb0) + *(float *)(uVar25 + 0x50);
              auVar50._4_4_ = fVar5 * *(float *)(uVar25 + 0xb4) + *(float *)(uVar25 + 0x54);
              auVar50._8_4_ = fVar5 * *(float *)(uVar25 + 0xb8) + *(float *)(uVar25 + 0x58);
              auVar50._12_4_ = fVar5 * *(float *)(uVar25 + 0xbc) + *(float *)(uVar25 + 0x5c);
              auVar52._0_4_ = fVar5 * *(float *)(uVar25 + 0xd0) + *(float *)(uVar25 + 0x70);
              auVar52._4_4_ = fVar5 * *(float *)(uVar25 + 0xd4) + *(float *)(uVar25 + 0x74);
              auVar52._8_4_ = fVar5 * *(float *)(uVar25 + 0xd8) + *(float *)(uVar25 + 0x78);
              auVar52._12_4_ = fVar5 * *(float *)(uVar25 + 0xdc) + *(float *)(uVar25 + 0x7c);
              auVar16._4_4_ = fStack_1024;
              auVar16._0_4_ = local_1028;
              auVar16._8_4_ = fStack_1020;
              auVar16._12_4_ = fStack_101c;
              auVar35 = vmaxps_avx(auVar16,auVar38);
              auVar35 = vminps_avx(auVar35,auVar48);
              auVar37 = vsubps_avx(auVar35,auVar16);
              auVar14._4_4_ = fStack_1034;
              auVar14._0_4_ = local_1038;
              auVar14._8_4_ = fStack_1030;
              auVar14._12_4_ = fStack_102c;
              auVar35 = vmaxps_avx(auVar14,auVar42);
              auVar35 = vminps_avx(auVar35,auVar50);
              auVar41 = vsubps_avx(auVar35,auVar14);
              auVar12._4_4_ = fStack_1044;
              auVar12._0_4_ = local_1048;
              auVar12._8_4_ = fStack_1040;
              auVar12._12_4_ = fStack_103c;
              auVar35 = vmaxps_avx(auVar12,auVar45);
              auVar35 = vminps_avx(auVar35,auVar52);
              auVar35 = vsubps_avx(auVar35,auVar12);
              local_1058._0_4_ =
                   auVar37._0_4_ * auVar37._0_4_ + auVar41._0_4_ * auVar41._0_4_ +
                   auVar35._0_4_ * auVar35._0_4_;
              local_1058._4_4_ =
                   auVar37._4_4_ * auVar37._4_4_ + auVar41._4_4_ * auVar41._4_4_ +
                   auVar35._4_4_ * auVar35._4_4_;
              fStack_1050 = auVar37._8_4_ * auVar37._8_4_ + auVar41._8_4_ * auVar41._8_4_ +
                            auVar35._8_4_ * auVar35._8_4_;
              fStack_104c = auVar37._12_4_ * auVar37._12_4_ + auVar41._12_4_ * auVar41._12_4_ +
                            auVar35._12_4_ * auVar35._12_4_;
              auVar20._4_4_ = fStack_f84;
              auVar20._0_4_ = local_f88;
              auVar20._8_4_ = fStack_f80;
              auVar20._12_4_ = fStack_f7c;
              auVar35 = vcmpps_avx(_local_1058,auVar20,2);
              auVar37 = vcmpps_avx(auVar38,auVar48,2);
              auVar35 = vandps_avx(auVar35,auVar37);
              if (((uint)uVar26 & 7) == 6) {
LAB_012be5ee:
                auVar37 = vcmpps_avx(*(undefined1 (*) [16])((uVar26 & 0xfffffffffffffff0) + 0xe0),
                                     auVar34,2);
                auVar41 = vcmpps_avx(auVar34,*(undefined1 (*) [16])
                                              ((uVar26 & 0xfffffffffffffff0) + 0xf0),1);
                auVar37 = vandps_avx(auVar37,auVar41);
                auVar35 = vandps_avx(auVar37,auVar35);
                auVar35 = vpslld_avx(auVar35,0x1f);
                goto LAB_012be611;
              }
              uVar31 = vmovmskps_avx(auVar35);
              local_1018 = CONCAT44(uVar33,uVar31);
            }
          }
          else if ((uVar26 & 8) == 0) {
            uVar25 = uVar26 & 0xfffffffffffffff0;
            fVar5 = query->time;
            auVar34._4_4_ = fVar5;
            auVar34._0_4_ = fVar5;
            auVar34._8_4_ = fVar5;
            auVar34._12_4_ = fVar5;
            auVar43._0_4_ = fVar5 * *(float *)(uVar25 + 0x80) + *(float *)(uVar25 + 0x20);
            auVar43._4_4_ = fVar5 * *(float *)(uVar25 + 0x84) + *(float *)(uVar25 + 0x24);
            auVar43._8_4_ = fVar5 * *(float *)(uVar25 + 0x88) + *(float *)(uVar25 + 0x28);
            auVar43._12_4_ = fVar5 * *(float *)(uVar25 + 0x8c) + *(float *)(uVar25 + 0x2c);
            auVar46._0_4_ = fVar5 * *(float *)(uVar25 + 0xa0) + *(float *)(uVar25 + 0x40);
            auVar46._4_4_ = fVar5 * *(float *)(uVar25 + 0xa4) + *(float *)(uVar25 + 0x44);
            auVar46._8_4_ = fVar5 * *(float *)(uVar25 + 0xa8) + *(float *)(uVar25 + 0x48);
            auVar46._12_4_ = fVar5 * *(float *)(uVar25 + 0xac) + *(float *)(uVar25 + 0x4c);
            auVar39._0_4_ = fVar5 * *(float *)(uVar25 + 0xc0) + *(float *)(uVar25 + 0x60);
            auVar39._4_4_ = fVar5 * *(float *)(uVar25 + 0xc4) + *(float *)(uVar25 + 100);
            auVar39._8_4_ = fVar5 * *(float *)(uVar25 + 200) + *(float *)(uVar25 + 0x68);
            auVar39._12_4_ = fVar5 * *(float *)(uVar25 + 0xcc) + *(float *)(uVar25 + 0x6c);
            auVar49._0_4_ = fVar5 * *(float *)(uVar25 + 0x90) + *(float *)(uVar25 + 0x30);
            auVar49._4_4_ = fVar5 * *(float *)(uVar25 + 0x94) + *(float *)(uVar25 + 0x34);
            auVar49._8_4_ = fVar5 * *(float *)(uVar25 + 0x98) + *(float *)(uVar25 + 0x38);
            auVar49._12_4_ = fVar5 * *(float *)(uVar25 + 0x9c) + *(float *)(uVar25 + 0x3c);
            auVar51._0_4_ = fVar5 * *(float *)(uVar25 + 0xb0) + *(float *)(uVar25 + 0x50);
            auVar51._4_4_ = fVar5 * *(float *)(uVar25 + 0xb4) + *(float *)(uVar25 + 0x54);
            auVar51._8_4_ = fVar5 * *(float *)(uVar25 + 0xb8) + *(float *)(uVar25 + 0x58);
            auVar51._12_4_ = fVar5 * *(float *)(uVar25 + 0xbc) + *(float *)(uVar25 + 0x5c);
            auVar53._0_4_ = fVar5 * *(float *)(uVar25 + 0xd0) + *(float *)(uVar25 + 0x70);
            auVar53._4_4_ = fVar5 * *(float *)(uVar25 + 0xd4) + *(float *)(uVar25 + 0x74);
            auVar53._8_4_ = fVar5 * *(float *)(uVar25 + 0xd8) + *(float *)(uVar25 + 0x78);
            auVar53._12_4_ = fVar5 * *(float *)(uVar25 + 0xdc) + *(float *)(uVar25 + 0x7c);
            auVar17._4_4_ = fStack_1024;
            auVar17._0_4_ = local_1028;
            auVar17._8_4_ = fStack_1020;
            auVar17._12_4_ = fStack_101c;
            auVar35 = vmaxps_avx(auVar17,auVar43);
            auVar35 = vminps_avx(auVar35,auVar49);
            auVar37 = vsubps_avx(auVar35,auVar17);
            auVar15._4_4_ = fStack_1034;
            auVar15._0_4_ = local_1038;
            auVar15._8_4_ = fStack_1030;
            auVar15._12_4_ = fStack_102c;
            auVar35 = vmaxps_avx(auVar15,auVar46);
            auVar35 = vminps_avx(auVar35,auVar51);
            auVar41 = vsubps_avx(auVar35,auVar15);
            auVar13._4_4_ = fStack_1044;
            auVar13._0_4_ = local_1048;
            auVar13._8_4_ = fStack_1040;
            auVar13._12_4_ = fStack_103c;
            auVar35 = vmaxps_avx(auVar13,auVar39);
            auVar35 = vminps_avx(auVar35,auVar53);
            auVar35 = vsubps_avx(auVar35,auVar13);
            local_1058._4_4_ =
                 auVar35._4_4_ * auVar35._4_4_ +
                 auVar41._4_4_ * auVar41._4_4_ + auVar37._4_4_ * auVar37._4_4_;
            local_1058._0_4_ =
                 auVar35._0_4_ * auVar35._0_4_ +
                 auVar41._0_4_ * auVar41._0_4_ + auVar37._0_4_ * auVar37._0_4_;
            fStack_1050 = auVar35._8_4_ * auVar35._8_4_ +
                          auVar41._8_4_ * auVar41._8_4_ + auVar37._8_4_ * auVar37._8_4_;
            fStack_104c = auVar35._12_4_ * auVar35._12_4_ +
                          auVar41._12_4_ * auVar41._12_4_ + auVar37._12_4_ * auVar37._12_4_;
            auVar35 = vcmpps_avx(auVar43,auVar49,2);
            auVar37 = vcmpps_avx(auVar51,local_fc8,5);
            auVar35 = vandps_avx(auVar35,auVar37);
            auVar19._4_4_ = fStack_fb4;
            auVar19._0_4_ = local_fb8;
            auVar19._8_4_ = fStack_fb0;
            auVar19._12_4_ = fStack_fac;
            auVar37 = vcmpps_avx(auVar43,auVar19,2);
            auVar18._4_4_ = fStack_fd4;
            auVar18._0_4_ = local_fd8;
            auVar18._8_4_ = fStack_fd0;
            auVar18._12_4_ = fStack_fcc;
            auVar41 = vcmpps_avx(auVar46,auVar18,2);
            auVar37 = vandps_avx(auVar41,auVar37);
            auVar41 = vcmpps_avx(auVar53,local_fe8,5);
            auVar35 = vandps_avx(auVar35,auVar41);
            auVar41 = vcmpps_avx(auVar49,local_fa8,5);
            auVar9 = vcmpps_avx(auVar39,local_ff8,2);
            auVar41 = vandps_avx(auVar9,auVar41);
            auVar37 = vandps_avx(auVar37,auVar41);
            auVar35 = vandps_avx(auVar37,auVar35);
            if (((uint)uVar26 & 7) == 6) goto LAB_012be5ee;
            auVar35 = vpslld_avx(auVar35,0x1f);
LAB_012be611:
            uVar31 = vmovmskps_avx(auVar35);
            local_1018 = CONCAT44(uVar33,uVar31);
          }
          if ((uVar26 & 8) == 0) {
            if (local_1018 == 0) {
              iVar24 = 4;
            }
            else {
              uVar25 = uVar26 & 0xfffffffffffffff0;
              lVar27 = 0;
              if (local_1018 != 0) {
                for (; (local_1018 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                }
              }
              iVar24 = 0;
              uVar26 = *(ulong *)(uVar25 + lVar27 * 8);
              uVar28 = local_1018 - 1 & local_1018;
              if (uVar28 != 0) {
                uVar3 = *(uint *)(local_1058 + lVar27 * 4);
                lVar27 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                  }
                }
                uVar4 = *(ulong *)(uVar25 + lVar27 * 8);
                uVar2 = *(uint *)(local_1058 + lVar27 * 4);
                uVar28 = uVar28 - 1 & uVar28;
                if (uVar28 == 0) {
                  if (uVar3 < uVar2) {
                    *(ulong *)*local_1010 = uVar4;
                    *(uint *)(*local_1010 + 8) = uVar2;
                    local_1010 = local_1010 + 1;
                  }
                  else {
                    *(ulong *)*local_1010 = uVar26;
                    *(uint *)(*local_1010 + 8) = uVar3;
                    uVar26 = uVar4;
                    local_1010 = local_1010 + 1;
                  }
                }
                else {
                  auVar36._8_8_ = 0;
                  auVar36._0_8_ = uVar26;
                  auVar35 = vpunpcklqdq_avx(auVar36,ZEXT416(uVar3));
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = uVar4;
                  auVar37 = vpunpcklqdq_avx(auVar40,ZEXT416(uVar2));
                  lVar27 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                    }
                  }
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = *(ulong *)(uVar25 + lVar27 * 8);
                  auVar41 = vpunpcklqdq_avx(auVar44,ZEXT416(*(uint *)(local_1058 + lVar27 * 4)));
                  uVar28 = uVar28 - 1 & uVar28;
                  if (uVar28 == 0) {
                    auVar9 = vpcmpgtd_avx(auVar37,auVar35);
                    auVar10 = vpshufd_avx(auVar9,0xaa);
                    auVar9 = vblendvps_avx(auVar37,auVar35,auVar10);
                    auVar35 = vblendvps_avx(auVar35,auVar37,auVar10);
                    auVar37 = vpcmpgtd_avx(auVar41,auVar9);
                    auVar10 = vpshufd_avx(auVar37,0xaa);
                    auVar37 = vblendvps_avx(auVar41,auVar9,auVar10);
                    auVar41 = vblendvps_avx(auVar9,auVar41,auVar10);
                    auVar9 = vpcmpgtd_avx(auVar41,auVar35);
                    auVar10 = vpshufd_avx(auVar9,0xaa);
                    auVar9 = vblendvps_avx(auVar41,auVar35,auVar10);
                    auVar35 = vblendvps_avx(auVar35,auVar41,auVar10);
                    *local_1010 = auVar35;
                    local_1010[1] = auVar9;
                    uVar26 = auVar37._0_8_;
                    local_1010 = local_1010 + 2;
                  }
                  else {
                    lVar27 = 0;
                    if (uVar28 != 0) {
                      for (; (uVar28 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                      }
                    }
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = *(ulong *)(uVar25 + lVar27 * 8);
                    auVar11 = vpunpcklqdq_avx(auVar47,ZEXT416(*(uint *)(local_1058 + lVar27 * 4)));
                    auVar9 = vpcmpgtd_avx(auVar37,auVar35);
                    auVar10 = vpshufd_avx(auVar9,0xaa);
                    auVar9 = vblendvps_avx(auVar37,auVar35,auVar10);
                    auVar35 = vblendvps_avx(auVar35,auVar37,auVar10);
                    auVar37 = vpcmpgtd_avx(auVar11,auVar41);
                    auVar10 = vpshufd_avx(auVar37,0xaa);
                    auVar37 = vblendvps_avx(auVar11,auVar41,auVar10);
                    auVar41 = vblendvps_avx(auVar41,auVar11,auVar10);
                    auVar10 = vpcmpgtd_avx(auVar41,auVar35);
                    auVar11 = vpshufd_avx(auVar10,0xaa);
                    auVar10 = vblendvps_avx(auVar41,auVar35,auVar11);
                    auVar35 = vblendvps_avx(auVar35,auVar41,auVar11);
                    auVar41 = vpcmpgtd_avx(auVar37,auVar9);
                    auVar11 = vpshufd_avx(auVar41,0xaa);
                    auVar41 = vblendvps_avx(auVar37,auVar9,auVar11);
                    auVar37 = vblendvps_avx(auVar9,auVar37,auVar11);
                    auVar9 = vpcmpgtd_avx(auVar10,auVar37);
                    auVar11 = vpshufd_avx(auVar9,0xaa);
                    auVar9 = vblendvps_avx(auVar10,auVar37,auVar11);
                    auVar37 = vblendvps_avx(auVar37,auVar10,auVar11);
                    *local_1010 = auVar35;
                    local_1010[1] = auVar37;
                    local_1010[2] = auVar9;
                    uVar26 = auVar41._0_8_;
                    local_1010 = local_1010 + 3;
                    iVar24 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar24 = 6;
          }
        } while (iVar24 == 0);
      } while ((iVar24 != 6) || (local_1008 = (ulong)((uint)uVar26 & 0xf) - 8, local_1008 == 0));
      lVar27 = (uVar26 & 0xfffffffffffffff0) + 0x50;
      lVar32 = 0;
      uVar26 = 0;
      do {
        local_1000 = uVar26;
        bVar29 = 0;
        lVar30 = 0;
        do {
          if (*(int *)(lVar27 + lVar30 * 4) == -1) break;
          uVar3 = *(uint *)(lVar27 + -0x10 + lVar30 * 4);
          this = (context->scene->geometries).items[uVar3].ptr;
          context->geomID = uVar3;
          context->primID = *(uint *)(lVar27 + lVar30 * 4);
          bVar22 = Geometry::pointQuery(this,query,context);
          bVar29 = bVar29 | bVar22;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 4);
        uVar26 = CONCAT71((int7)(local_1000 >> 8),(byte)local_1000 | bVar29);
        lVar32 = lVar32 + 1;
        lVar27 = lVar27 + 0x60;
      } while (lVar32 != local_1008);
      auVar54 = ZEXT1664(local_f98);
    } while ((local_1000 & 1) == 0 && bVar29 == 0);
    uVar33 = *(undefined4 *)&(context->query_radius).field_0;
    auVar35._4_4_ = uVar33;
    auVar35._0_4_ = uVar33;
    auVar35._8_4_ = uVar33;
    auVar35._12_4_ = uVar33;
    uVar33 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar37._4_4_ = uVar33;
    auVar37._0_4_ = uVar33;
    auVar37._8_4_ = uVar33;
    auVar37._12_4_ = uVar33;
    uVar33 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar41._4_4_ = uVar33;
    auVar41._0_4_ = uVar33;
    auVar41._8_4_ = uVar33;
    auVar41._12_4_ = uVar33;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar54 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar1 = (context->query_radius).field_0;
      auVar9 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
      auVar54 = ZEXT1664(auVar9);
    }
    bVar23 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }